

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O2

void SRCTools::SincResampler::Utils::computeResampleFactors
               (uint *upsampleFactor,double *downsampleFactor,double inputFrequency,
               double outputFrequency,uint maxUpsampleFactor)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  
  uVar2 = (ulong)outputFrequency;
  uVar6 = (uint)uVar2;
  *upsampleFactor = uVar6;
  if (((double)(uVar2 & 0xffffffff) == outputFrequency) &&
     (!NAN((double)(uVar2 & 0xffffffff)) && !NAN(outputFrequency))) {
    uVar4 = (ulong)inputFrequency;
    dVar7 = (double)(uVar4 & 0xffffffff);
    if ((dVar7 == inputFrequency) && (!NAN(dVar7) && !NAN(inputFrequency))) {
      uVar1 = uVar4 & 0xffffffff;
      uVar5 = uVar2 & 0xffffffff;
      while (uVar3 = uVar1, (int)uVar3 != 0) {
        uVar1 = uVar5 % uVar3;
        uVar5 = uVar3;
      }
      if (1 < (uint)uVar5) {
        uVar6 = (uint)((uVar2 & 0xffffffff) / uVar5);
        *upsampleFactor = uVar6;
        dVar7 = (double)(int)((uVar4 & 0xffffffff) / uVar5);
      }
      *downsampleFactor = dVar7;
      if (uVar6 <= maxUpsampleFactor) {
        return;
      }
      goto LAB_00166cbf;
    }
  }
  for (uVar6 = 1; uVar6 <= maxUpsampleFactor; uVar6 = uVar6 + 1) {
    dVar7 = (double)uVar6 * (inputFrequency / outputFrequency);
    dVar8 = floor(dVar7 * 1e+15 + 0.5);
    dVar7 = floor(dVar7 + 0.5);
    if ((dVar8 == dVar7 * 1e+15) && (!NAN(dVar8) && !NAN(dVar7 * 1e+15))) {
      *upsampleFactor = uVar6;
      goto LAB_00166cd7;
    }
  }
LAB_00166cbf:
  *upsampleFactor = maxUpsampleFactor;
  dVar7 = ((double)maxUpsampleFactor * inputFrequency) / outputFrequency;
LAB_00166cd7:
  *downsampleFactor = dVar7;
  return;
}

Assistant:

void Utils::computeResampleFactors(unsigned int &upsampleFactor, double &downsampleFactor, const double inputFrequency, const double outputFrequency, const unsigned int maxUpsampleFactor) {
	static const double RATIONAL_RATIO_ACCURACY_FACTOR = 1E15;

	upsampleFactor = static_cast<unsigned int>(outputFrequency);
	unsigned int downsampleFactorInt = static_cast<unsigned int>(inputFrequency);
	if ((upsampleFactor == outputFrequency) && (downsampleFactorInt == inputFrequency)) {
		// Input and output frequencies are integers, try to reduce them
		const unsigned int gcd = greatestCommonDivisor(upsampleFactor, downsampleFactorInt);
		if (gcd > 1) {
			upsampleFactor /= gcd;
			downsampleFactor = downsampleFactorInt / gcd;
		} else {
			downsampleFactor = downsampleFactorInt;
		}
		if (upsampleFactor <= maxUpsampleFactor) return;
	} else {
		// Try to recover rational resample ratio by brute force
		double inputToOutputRatio = inputFrequency / outputFrequency;
		for (unsigned int i = 1; i <= maxUpsampleFactor; ++i) {
			double testFactor = inputToOutputRatio * i;
			if (floor(RATIONAL_RATIO_ACCURACY_FACTOR * testFactor + 0.5) == RATIONAL_RATIO_ACCURACY_FACTOR * floor(testFactor + 0.5)) {
				// inputToOutputRatio found to be rational within the accuracy
				upsampleFactor = i;
				downsampleFactor = floor(testFactor + 0.5);
				return;
			}
		}
	}
	// Use interpolation of FIR taps as the last resort
	upsampleFactor = maxUpsampleFactor;
	downsampleFactor = maxUpsampleFactor * inputFrequency / outputFrequency;
}